

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::LessThanAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *pJVar1;
  Var aValue;
  RecyclableObject *pRVar2;
  undefined1 *aValue_00;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)48>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar1->VarArray[0]);
  if (aValue != (Var)0x0) {
    if ((ulong)aValue >> 0x30 == 0) {
      pRVar2 = Js::VarTo<Js::RecyclableObject>(aValue);
      if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
      }
    }
    aValue_00 = (undefined1 *)InflateVarInReplay(executeContext,pJVar1->VarArray[1]);
    if (aValue_00 != (undefined1 *)0x0) {
      if (aValue_00 < &DAT_1000000000000) {
        pRVar2 = Js::VarTo<Js::RecyclableObject>(aValue_00);
        if ((((((pRVar2->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          aValue_00 = (undefined1 *)Js::CrossSite::MarshalVar(scriptContext,pRVar2,false);
        }
      }
      if (pJVar1->ScalarArray[0] != 0) {
        Js::JavascriptOperators::LessEqual(aValue,aValue_00,scriptContext);
        return;
      }
      Js::JavascriptOperators::Less(aValue,aValue_00,scriptContext);
      return;
    }
  }
  return;
}

Assistant:

void LessThanAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarSingleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarSingleScalarArgumentAction, EventKind::LessThanActionTag>(evt);
            Js::Var object1 = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object1, ctx);
            Js::Var object2 = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(object2, ctx);

            //Result is not needed but trigger computation for any effects
            if (GetScalarItem_0(action))
            {
                Js::JavascriptOperators::LessEqual(object1, object2, ctx);
            }
            else
            {
                Js::JavascriptOperators::Less(object1, object2, ctx);
            }
        }